

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pPerformanceTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Performance::PerformanceTests::init(PerformanceTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  PerformanceTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  BlendTests::BlendTests((BlendTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureTestGroup::TextureTestGroup
            ((TextureTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShadersTestGroup::ShadersTestGroup
            ((ShadersTestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderCompilerTests::ShaderCompilerTests
            ((ShaderCompilerTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  APITestGroup::APITestGroup((APITestGroup *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void PerformanceTests::init (void)
{
	addChild(new BlendTests					(m_context));
	addChild(new TextureTestGroup			(m_context));
	addChild(new ShadersTestGroup			(m_context));
	addChild(new ShaderCompilerTests		(m_context));
	addChild(new APITestGroup				(m_context));
}